

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.cpp
# Opt level: O2

void __thiscall Clasp::SmallClauseAlloc::allocBlock(SmallClauseAlloc *this)

{
  Block *pBVar1;
  Chunk *pCVar2;
  long lVar3;
  bool bVar4;
  
  pBVar1 = (Block *)operator_new(0x8000);
  pCVar2 = pBVar1->chunk;
  lVar3 = 0x3fe;
  while (pCVar2 = pCVar2 + 1, bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    pCVar2[-1].next = pCVar2;
  }
  pBVar1->chunk[0x3fe].next = this->freeList_;
  this->freeList_ = pBVar1->chunk;
  pBVar1->next = this->blocks_;
  this->blocks_ = pBVar1;
  return;
}

Assistant:

void SmallClauseAlloc::allocBlock() {
	Block* r = (Block*)::operator new(sizeof(Block));
	for (uint32 i = 0; i < Block::num_chunks-1; ++i) {
		r->chunk[i].next = &r->chunk[i+1];
	}
	r->chunk[Block::num_chunks-1].next = freeList_;
	freeList_ = r->chunk;
	r->next   = blocks_;
	blocks_   = r;
}